

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTDMT_sizeof_CCtx(ZSTDMT_CCtx *mtctx)

{
  uint uVar1;
  uint uVar2;
  pthread_mutex_t *__mutex;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  
  if (mtctx == (ZSTDMT_CCtx *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = POOL_sizeof(mtctx->factory);
    sVar4 = ZSTDMT_sizeof_bufferPool(mtctx->bufPool);
    uVar1 = mtctx->jobIDMask;
    __mutex = (pthread_mutex_t *)mtctx->cctxPool;
    pthread_mutex_lock(__mutex);
    uVar2 = __mutex[1].__data.__lock;
    lVar7 = 0;
    for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
      sVar5 = ZSTD_sizeof_CCtx(*(ZSTD_CCtx **)((long)__mutex + uVar8 * 8 + 0x48));
      lVar7 = lVar7 + sVar5;
    }
    pthread_mutex_unlock(__mutex);
    if ((ulong)uVar2 == 0) {
      __assert_fail("nbWorkers > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8684,"size_t ZSTDMT_sizeof_CCtxPool(ZSTDMT_CCtxPool *)");
    }
    sVar5 = ZSTDMT_sizeof_bufferPool(mtctx->seqPool);
    sVar6 = ZSTD_sizeof_CDict(mtctx->cdictLocal);
    sVar3 = (mtctx->roundBuff).capacity +
            sVar3 + sVar4 + (ulong)(uVar1 + 1) * 0x1b8 + (ulong)(uVar2 - 1) * 8 + lVar7 + sVar5 +
            sVar6 + 0xc60;
  }
  return sVar3;
}

Assistant:

size_t ZSTDMT_sizeof_CCtx(ZSTDMT_CCtx* mtctx)
{
    if (mtctx == NULL) return 0;   /* supports sizeof NULL */
    return sizeof(*mtctx)
            + POOL_sizeof(mtctx->factory)
            + ZSTDMT_sizeof_bufferPool(mtctx->bufPool)
            + (mtctx->jobIDMask+1) * sizeof(ZSTDMT_jobDescription)
            + ZSTDMT_sizeof_CCtxPool(mtctx->cctxPool)
            + ZSTDMT_sizeof_seqPool(mtctx->seqPool)
            + ZSTD_sizeof_CDict(mtctx->cdictLocal)
            + mtctx->roundBuff.capacity;
}